

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O0

Vector3D * __thiscall CGL::DiffuseBSDF::f(DiffuseBSDF *this,Vector3D *wo,Vector3D *wi)

{
  Vector3D *in_RSI;
  Vector3D *in_RDI;
  Vector3D *in_stack_ffffffffffffff98;
  Vector3D local_48 [2];
  
  Vector3D::Vector3D(local_48,0.3183098861837907);
  Vector3D::operator*(in_RSI,in_stack_ffffffffffffff98);
  return in_RDI;
}

Assistant:

Vector3D DiffuseBSDF::f(const Vector3D wo, const Vector3D wi) {
  // TODO (Part 3.1):
  // This function takes in both wo and wi and returns the evaluation of
  // the BSDF for those two directions.

  // Diffuse reflecrs light uniformly across hemisphere, so for each solid angle,
  // the ratio is 1/2PI.
  // Also make sure to multiply by the reflectance function
  return Vector3D(1.0 / PI) * reflectance;
}